

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

CURLcode ossl_random(Curl_easy *data,uchar *entropy,size_t length)

{
  CURLcode CVar1;
  int iVar2;
  
  if (data == (Curl_easy *)0x0) {
    iVar2 = RAND_status();
    if (iVar2 == 0) {
      return CURLE_FAILED_INIT;
    }
  }
  else {
    CVar1 = ossl_seed(data);
    if (CVar1 != CURLE_OK) {
      return CURLE_FAILED_INIT;
    }
  }
  iVar2 = curlx_uztosi(length);
  iVar2 = RAND_bytes(entropy,iVar2);
  return (uint)(iVar2 != 1) * 2;
}

Assistant:

static CURLcode ossl_random(struct Curl_easy *data,
                            unsigned char *entropy, size_t length)
{
  int rc;
  if(data) {
    if(ossl_seed(data)) /* Initiate the seed if not already done */
      return CURLE_FAILED_INIT; /* could not seed for some reason */
  }
  else {
    if(!rand_enough())
      return CURLE_FAILED_INIT;
  }
  /* RAND_bytes() returns 1 on success, 0 otherwise.  */
  rc = RAND_bytes(entropy, (ossl_valsize_t)curlx_uztosi(length));
  return rc == 1 ? CURLE_OK : CURLE_FAILED_INIT;
}